

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

int32_t uprv_copyEbcdic_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                          UErrorCode *pErrorCode)

{
  byte bVar1;
  UBool UVar2;
  int local_48;
  int32_t count;
  uint8_t c;
  uint8_t *s;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if ((((ds == (UDataSwapper *)0x0) || (inData == (void *)0x0)) || (length < 0)) ||
          ((local_48 = length, _count = (byte *)inData, 0 < length && (outData == (void *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    ds_local._4_4_ = 0;
  }
  else {
    for (; 0 < local_48; local_48 = local_48 + -1) {
      if ((*_count != 0) &&
         (((bVar1 = ""[*_count], bVar1 == 0 || (0x7f < bVar1)) ||
          ((invariantChars[(int)(uint)bVar1 >> 5] & 1 << (bVar1 & 0x1f)) == 0)))) {
        udata_printError_63(ds,
                            "uprv_copyEbcdic() string[%] contains a variant character in position %d\n"
                            ,(ulong)(uint)length,(ulong)(uint)(length - local_48));
        *pErrorCode = U_INVALID_CHAR_FOUND;
        return 0;
      }
      _count = _count + 1;
    }
    ds_local._4_4_ = length;
    if ((0 < length) && (inData != outData)) {
      memcpy(outData,inData,(long)length);
    }
  }
  return ds_local._4_4_;
}

Assistant:

U_CFUNC int32_t
uprv_copyEbcdic(const UDataSwapper *ds,
                const void *inData, int32_t length, void *outData,
                UErrorCode *pErrorCode) {
    const uint8_t *s;
    uint8_t c;

    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and checking */
    s=(const uint8_t *)inData;
    count=length;
    while(count>0) {
        c=*s++;
        if(c!=0 && ((c=asciiFromEbcdic[c])==0 || !UCHAR_IS_INVARIANT(c))) {
            udata_printError(ds, "uprv_copyEbcdic() string[%] contains a variant character in position %d\n",
                             length, length-count);
            *pErrorCode=U_INVALID_CHAR_FOUND;
            return 0;
        }
        --count;
    }

    if(length>0 && inData!=outData) {
        uprv_memcpy(outData, inData, length);
    }

    return length;
}